

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void __thiscall
testing::internal::ExpectationBase::DescribeCallCountTo(ExpectationBase *this,ostream *os)

{
  element_type *peVar1;
  bool bVar2;
  int actual_call_count;
  ostream *poVar3;
  char *pcVar4;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  std::operator<<(os,"         Expected: to be ");
  peVar1 = (this->cardinality_).impl_.
           super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_CardinalityInterface[6])(peVar1,os);
  std::operator<<(os,"\n           Actual: ");
  actual_call_count = call_count(this);
  Cardinality::DescribeActualCallCountTo(actual_call_count,os);
  poVar3 = std::operator<<(os," - ");
  bVar2 = IsOverSaturated(this);
  if (bVar2) {
    pcVar4 = "over-saturated";
  }
  else {
    bVar2 = IsSaturated(this);
    if (bVar2) {
      pcVar4 = "saturated";
    }
    else {
      bVar2 = IsSatisfied(this);
      pcVar4 = "unsatisfied";
      if (bVar2) {
        pcVar4 = "satisfied";
      }
    }
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3," and ");
  bVar2 = is_retired(this);
  pcVar4 = "active";
  if (bVar2) {
    pcVar4 = "retired";
  }
  std::operator<<(poVar3,pcVar4);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();

  // Describes how many times the function is expected to be called.
  *os << "         Expected: to be ";
  cardinality().DescribeTo(os);
  *os << "\n           Actual: ";
  Cardinality::DescribeActualCallCountTo(call_count(), os);

  // Describes the state of the expectation (e.g. is it satisfied?
  // is it active?).
  *os << " - "
      << (IsOverSaturated() ? "over-saturated"
          : IsSaturated()   ? "saturated"
          : IsSatisfied()   ? "satisfied"
                            : "unsatisfied")
      << " and " << (is_retired() ? "retired" : "active");
}